

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

pair<bool,_Point> intersection(Segment *segment,Triangle *triangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pair<bool,_Point> pVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint local_18;
  undefined8 uStack_14;
  
  uVar1 = (segment->b).x;
  uVar5 = (segment->b).y;
  fVar13 = (float)uVar5 - (segment->a).y;
  fVar15 = (float)uVar1 - (segment->a).x;
  fVar12 = (segment->a).z;
  fVar21 = (segment->b).z - fVar12;
  fVar10 = SQRT(fVar21 * fVar21 + fVar15 * fVar15 + fVar13 * fVar13);
  fVar15 = fVar15 / fVar10;
  fVar13 = fVar13 / fVar10;
  fVar21 = fVar21 / fVar10;
  uVar2 = (triangle->y).x;
  uVar6 = (triangle->y).y;
  fVar10 = (triangle->x).x;
  fVar23 = (triangle->x).y;
  fVar26 = (float)uVar2 - fVar10;
  fVar18 = (float)uVar6 - fVar23;
  fVar25 = (triangle->x).z;
  uVar3 = (triangle->z).x;
  uVar7 = (triangle->z).y;
  fVar16 = (float)uVar3 - fVar10;
  fVar17 = (float)uVar7 - fVar23;
  fVar19 = (triangle->z).z - fVar25;
  fVar11 = fVar13 * fVar19 - fVar21 * fVar17;
  fVar14 = fVar21 * fVar16 - fVar19 * fVar15;
  fVar22 = fVar15 * fVar17 - fVar16 * fVar13;
  fVar20 = (triangle->y).z - fVar25;
  fVar24 = fVar20 * fVar22 + fVar26 * fVar11 + fVar18 * fVar14;
  if (1.1920929e-07 <= ABS(fVar24)) {
    fVar24 = 1.0 / fVar24;
    uVar4 = (segment->a).x;
    uVar8 = (segment->a).y;
    fVar10 = (float)uVar4 - fVar10;
    fVar23 = (float)uVar8 - fVar23;
    fVar25 = fVar12 - fVar25;
    fVar11 = (fVar22 * fVar25 + fVar11 * fVar10 + fVar14 * fVar23) * fVar24;
    if ((0.0 <= fVar11) && (fVar11 <= 1.0)) {
      fVar14 = fVar23 * fVar20 - fVar25 * fVar18;
      fVar25 = fVar25 * fVar26 - fVar20 * fVar10;
      fVar23 = fVar10 * fVar18 - fVar26 * fVar23;
      fVar10 = (fVar21 * fVar23 + fVar15 * fVar14 + fVar13 * fVar25) * fVar24;
      if ((0.0 <= fVar10) &&
         ((fVar11 + fVar10 <= 1.0 &&
          (fVar24 = fVar24 * (fVar19 * fVar23 + fVar16 * fVar14 + fVar17 * fVar25), 0.0 < fVar24))))
      {
        fVar12 = fVar12 + fVar21 * fVar24;
        local_18 = CONCAT31(local_18._1_3_,1);
        uStack_14 = CONCAT44(fVar13 * fVar24 + (float)uVar8,fVar15 * fVar24 + (float)uVar4);
        goto LAB_00108253;
      }
    }
    fVar12 = 0.0;
    local_18 = (uint)local_18._1_3_ << 8;
    uStack_14 = 0;
  }
  else {
    local_18 = local_18 & 0xffffff00;
    uStack_14 = 0;
    fVar12 = 0.0;
  }
LAB_00108253:
  pVar9.second.x = (float)(undefined4)uStack_14;
  pVar9.second.y = (float)uStack_14._4_4_;
  pVar9._0_4_ = local_18;
  pVar9.second.z = fVar12;
  return pVar9;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res};
  }

  return {false, {}};
}